

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O1

JsonT<void> * __thiscall rlib::JsonT<void>::operator=(JsonT<void> *this,JsonT<void> *s)

{
  undefined8 *puVar1;
  bool bVar2;
  double dVar3;
  undefined1 *local_38;
  size_type local_30;
  undefined1 local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  if (this != s) {
    clear(this);
    switch(s->m_type) {
    case Null:
      this->m_type = Null;
      break;
    case Bool:
      bVar2 = (s->field_1).m_bool;
      this->m_type = Bool;
      (this->field_1).m_bool = bVar2;
      break;
    case Float:
      dVar3 = (s->field_1).m_float;
      this->m_type = Float;
      (this->field_1).m_float = dVar3;
      break;
    case Int:
      dVar3 = (s->field_1).m_float;
      this->m_type = Int;
      (this->field_1).m_float = dVar3;
      break;
    case String:
      local_38 = &local_28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,(s->field_1).m_int,
                 (s->field_1).m_string._M_string_length + (s->field_1).m_int);
      this->m_type = String;
      puVar1 = (undefined8 *)((long)&this->field_1 + 0x10);
      (this->field_1).m_int = (intmax_t)puVar1;
      if (local_38 == &local_28) {
        *puVar1 = CONCAT71(uStack_27,local_28);
        *(undefined8 *)((long)&this->field_1 + 0x18) = uStack_20;
      }
      else {
        (this->field_1).m_int = (intmax_t)local_38;
        *(ulong *)((long)&this->field_1 + 0x10) = CONCAT71(uStack_27,local_28);
      }
      (this->field_1).m_string._M_string_length = local_30;
      break;
    case Array:
      this->m_type = Array;
      std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::vector
                ((vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
                 &(this->field_1).m_string,
                 (vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *)
                 &(s->field_1).m_string);
      break;
    case Map:
      this->m_type = Map;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                  *)&(this->field_1).m_string,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
                  *)&(s->field_1).m_string);
    }
  }
  return this;
}

Assistant:

JsonT& operator=(const JsonT& s) {
			if (this != &s) {
				clear();
				switch (s.m_type) {
				case Type::Null:	new(this) JsonT(nullptr);	break;
				case Type::Bool:	new(this) JsonT(s.m_bool);	break;
				case Type::Float:	new(this) JsonT(s.m_float);	break;
				case Type::Int:		new(this) JsonT(s.m_int);	break;
				case Type::String:	new(this) JsonT(s.m_string); break;
				case Type::Array:	new(this) JsonT(s.m_array);	break;
				case Type::Map:		new(this) JsonT(s.m_map);	break;
				default:		assert(false);
				}
			}
			return *this;
		}